

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgvalue.c
# Opt level: O0

mg_value * mg_value_copy_ca(mg_value *val,mg_allocator *allocator)

{
  _func_void_ptr_mg_allocator_ptr_void_ptr_size_t *p_Var1;
  mg_allocator *allocator_00;
  void *buf;
  mg_string *pmVar2;
  mg_list *pmVar3;
  mg_map *pmVar4;
  mg_node *pmVar5;
  mg_relationship *pmVar6;
  mg_unbound_relationship *pmVar7;
  mg_path *pmVar8;
  mg_date *pmVar9;
  mg_time *pmVar10;
  mg_local_time *pmVar11;
  mg_date_time *pmVar12;
  mg_date_time_zone_id *pmVar13;
  mg_local_date_time *pmVar14;
  mg_duration *pmVar15;
  mg_point_2d *pmVar16;
  mg_point_3d *pmVar17;
  mg_relationship *in_RSI;
  mg_allocator *in_RDI;
  mg_value *new_val;
  size_t in_stack_ffffffffffffffd8;
  mg_allocator *in_stack_ffffffffffffffe0;
  mg_path *in_stack_fffffffffffffff8;
  
  if (in_RDI == (mg_allocator *)0x0) {
    return (mg_value *)(mg_allocator *)0x0;
  }
  allocator_00 = (mg_allocator *)
                 mg_allocator_malloc(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  if (allocator_00 == (mg_allocator *)0x0) {
    return (mg_value *)(mg_allocator *)0x0;
  }
  *(undefined4 *)&allocator_00->malloc = *(undefined4 *)&in_RDI->malloc;
  buf = (void *)(ulong)*(uint *)&in_RDI->malloc;
  switch(buf) {
  case (void *)0x0:
    return (mg_value *)allocator_00;
  case (void *)0x1:
    *(undefined4 *)&allocator_00->realloc = *(undefined4 *)&in_RDI->realloc;
    return (mg_value *)allocator_00;
  case (void *)0x2:
    allocator_00->realloc = in_RDI->realloc;
    return (mg_value *)allocator_00;
  case (void *)0x3:
    allocator_00->realloc = in_RDI->realloc;
    return (mg_value *)allocator_00;
  case (void *)0x4:
    pmVar2 = mg_string_copy_ca((mg_string *)in_RSI,allocator_00);
    allocator_00->realloc = (_func_void_ptr_mg_allocator_ptr_void_ptr_size_t *)pmVar2;
    p_Var1 = allocator_00->realloc;
    goto joined_r0x0010e3ed;
  case (void *)0x5:
    pmVar3 = mg_list_copy_ca((mg_list *)in_RSI,allocator_00);
    allocator_00->realloc = (_func_void_ptr_mg_allocator_ptr_void_ptr_size_t *)pmVar3;
    p_Var1 = allocator_00->realloc;
joined_r0x0010e3ed:
    if (p_Var1 != (_func_void_ptr_mg_allocator_ptr_void_ptr_size_t *)0x0) {
      return (mg_value *)allocator_00;
    }
    goto LAB_0010e6db;
  case (void *)0x6:
    pmVar4 = mg_map_copy_ca((mg_map *)in_stack_fffffffffffffff8,in_RDI);
    allocator_00->realloc = (_func_void_ptr_mg_allocator_ptr_void_ptr_size_t *)pmVar4;
    p_Var1 = allocator_00->realloc;
    break;
  case (void *)0x7:
    pmVar5 = mg_node_copy_ca((mg_node *)in_RSI,allocator_00);
    allocator_00->realloc = (_func_void_ptr_mg_allocator_ptr_void_ptr_size_t *)pmVar5;
    p_Var1 = allocator_00->realloc;
    break;
  case (void *)0x8:
    pmVar6 = mg_relationship_copy_ca(in_RSI,allocator_00);
    allocator_00->realloc = (_func_void_ptr_mg_allocator_ptr_void_ptr_size_t *)pmVar6;
    p_Var1 = allocator_00->realloc;
    break;
  case (void *)0x9:
    pmVar7 = mg_unbound_relationship_copy_ca((mg_unbound_relationship *)in_RSI,allocator_00);
    allocator_00->realloc = (_func_void_ptr_mg_allocator_ptr_void_ptr_size_t *)pmVar7;
    p_Var1 = allocator_00->realloc;
    break;
  case (void *)0xa:
    pmVar8 = mg_path_copy_ca(in_stack_fffffffffffffff8,in_RDI);
    allocator_00->realloc = (_func_void_ptr_mg_allocator_ptr_void_ptr_size_t *)pmVar8;
    p_Var1 = allocator_00->realloc;
    break;
  case (void *)0xb:
    pmVar9 = mg_date_copy_ca((mg_date *)in_RSI,allocator_00);
    allocator_00->realloc = (_func_void_ptr_mg_allocator_ptr_void_ptr_size_t *)pmVar9;
    p_Var1 = allocator_00->realloc;
    break;
  case (void *)0xc:
    pmVar10 = mg_time_copy_ca((mg_time *)in_RSI,allocator_00);
    allocator_00->realloc = (_func_void_ptr_mg_allocator_ptr_void_ptr_size_t *)pmVar10;
    p_Var1 = allocator_00->realloc;
    break;
  case (void *)0xd:
    pmVar11 = mg_local_time_copy_ca((mg_local_time *)in_RSI,allocator_00);
    allocator_00->realloc = (_func_void_ptr_mg_allocator_ptr_void_ptr_size_t *)pmVar11;
    p_Var1 = allocator_00->realloc;
    break;
  case (void *)0xe:
    pmVar12 = mg_date_time_copy_ca((mg_date_time *)in_RSI,allocator_00);
    allocator_00->realloc = (_func_void_ptr_mg_allocator_ptr_void_ptr_size_t *)pmVar12;
    p_Var1 = allocator_00->realloc;
    break;
  case (void *)0xf:
    pmVar13 = mg_date_time_zone_id_copy_ca((mg_date_time_zone_id *)in_RSI,allocator_00);
    allocator_00->realloc = (_func_void_ptr_mg_allocator_ptr_void_ptr_size_t *)pmVar13;
    p_Var1 = allocator_00->realloc;
    break;
  case (void *)0x10:
    pmVar14 = mg_local_date_time_copy_ca((mg_local_date_time *)in_RSI,allocator_00);
    allocator_00->realloc = (_func_void_ptr_mg_allocator_ptr_void_ptr_size_t *)pmVar14;
    p_Var1 = allocator_00->realloc;
    break;
  case (void *)0x11:
    pmVar15 = mg_duration_copy_ca((mg_duration *)in_RSI,allocator_00);
    allocator_00->realloc = (_func_void_ptr_mg_allocator_ptr_void_ptr_size_t *)pmVar15;
    p_Var1 = allocator_00->realloc;
    break;
  case (void *)0x12:
    pmVar16 = mg_point_2d_copy_ca((mg_point_2d *)in_RSI,allocator_00);
    allocator_00->realloc = (_func_void_ptr_mg_allocator_ptr_void_ptr_size_t *)pmVar16;
    p_Var1 = allocator_00->realloc;
    break;
  case (void *)0x13:
    pmVar17 = mg_point_3d_copy_ca((mg_point_3d *)in_RSI,allocator_00);
    allocator_00->realloc = (_func_void_ptr_mg_allocator_ptr_void_ptr_size_t *)pmVar17;
    p_Var1 = allocator_00->realloc;
    break;
  case (void *)0x14:
  default:
    goto switchD_0010e343_default;
  }
  if (p_Var1 == (_func_void_ptr_mg_allocator_ptr_void_ptr_size_t *)0x0) {
LAB_0010e6db:
    mg_allocator_free(allocator_00,buf);
    allocator_00 = (mg_allocator *)0x0;
  }
switchD_0010e343_default:
  return (mg_value *)allocator_00;
}

Assistant:

mg_value *mg_value_copy_ca(const mg_value *val, mg_allocator *allocator) {
  if (!val) {
    return NULL;
  }
  mg_value *new_val = mg_allocator_malloc(allocator, sizeof(mg_value));
  if (!new_val) {
    return NULL;
  }
  new_val->type = val->type;
  switch (val->type) {
    case MG_VALUE_TYPE_NULL:
      break;
    case MG_VALUE_TYPE_BOOL:
      new_val->bool_v = val->bool_v;
      break;
    case MG_VALUE_TYPE_INTEGER:
      new_val->integer_v = val->integer_v;
      break;
    case MG_VALUE_TYPE_FLOAT:
      new_val->float_v = val->float_v;
      break;
    case MG_VALUE_TYPE_STRING:
      new_val->string_v = mg_string_copy_ca(val->string_v, allocator);
      if (!new_val->string_v) {
        goto cleanup;
      }
      break;
    case MG_VALUE_TYPE_LIST:
      new_val->list_v = mg_list_copy_ca(val->list_v, allocator);
      if (!new_val->list_v) {
        goto cleanup;
      }
      break;
    case MG_VALUE_TYPE_MAP:
      new_val->map_v = mg_map_copy_ca(val->map_v, allocator);
      if (!new_val->map_v) {
        goto cleanup;
      }
      break;
    case MG_VALUE_TYPE_NODE:
      new_val->node_v = mg_node_copy_ca(val->node_v, allocator);
      if (!new_val->node_v) {
        goto cleanup;
      }
      break;
    case MG_VALUE_TYPE_RELATIONSHIP:
      new_val->relationship_v =
          mg_relationship_copy_ca(val->relationship_v, allocator);
      if (!new_val->relationship_v) {
        goto cleanup;
      }
      break;
    case MG_VALUE_TYPE_UNBOUND_RELATIONSHIP:
      new_val->unbound_relationship_v = mg_unbound_relationship_copy_ca(
          val->unbound_relationship_v, allocator);
      if (!new_val->unbound_relationship_v) {
        goto cleanup;
      }
      break;
    case MG_VALUE_TYPE_PATH:
      new_val->path_v = mg_path_copy_ca(val->path_v, allocator);
      if (!new_val->path_v) {
        goto cleanup;
      }
      break;
    case MG_VALUE_TYPE_DATE:
      new_val->date_v = mg_date_copy_ca(val->date_v, allocator);
      if (!new_val->date_v) {
        goto cleanup;
      }
      break;
    case MG_VALUE_TYPE_TIME:
      new_val->time_v = mg_time_copy_ca(val->time_v, allocator);
      if (!new_val->time_v) {
        goto cleanup;
      }
      break;
    case MG_VALUE_TYPE_LOCAL_TIME:
      new_val->local_time_v =
          mg_local_time_copy_ca(val->local_time_v, allocator);
      if (!new_val->local_time_v) {
        goto cleanup;
      }
      break;
    case MG_VALUE_TYPE_DATE_TIME:
      new_val->date_time_v = mg_date_time_copy_ca(val->date_time_v, allocator);
      if (!new_val->date_time_v) {
        goto cleanup;
      }
      break;
    case MG_VALUE_TYPE_DATE_TIME_ZONE_ID:
      new_val->date_time_zone_id_v =
          mg_date_time_zone_id_copy_ca(val->date_time_zone_id_v, allocator);
      if (!new_val->date_time_zone_id_v) {
        goto cleanup;
      }
      break;
    case MG_VALUE_TYPE_LOCAL_DATE_TIME:
      new_val->local_date_time_v =
          mg_local_date_time_copy_ca(val->local_date_time_v, allocator);
      if (!new_val->local_date_time_v) {
        goto cleanup;
      }
      break;
    case MG_VALUE_TYPE_DURATION:
      new_val->duration_v = mg_duration_copy_ca(val->duration_v, allocator);
      if (!new_val->duration_v) {
        goto cleanup;
      }
      break;
    case MG_VALUE_TYPE_POINT_2D:
      new_val->point_2d_v = mg_point_2d_copy_ca(val->point_2d_v, allocator);
      if (!new_val->point_2d_v) {
        goto cleanup;
      }
      break;
    case MG_VALUE_TYPE_POINT_3D:
      new_val->point_3d_v = mg_point_3d_copy_ca(val->point_3d_v, allocator);
      if (!new_val->point_3d_v) {
        goto cleanup;
      }
      break;
    case MG_VALUE_TYPE_UNKNOWN:
      break;
  }
  return new_val;

cleanup:
  mg_allocator_free(&mg_system_allocator, new_val);
  return NULL;
}